

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

char * __thiscall cmState::GetCacheEntryProperty(cmState *this,string *key,string *propertyName)

{
  bool bVar1;
  char *pcVar2;
  CacheIterator it;
  CacheIterator local_18;
  
  local_18 = cmCacheManager::GetCacheIterator(this->CacheManager,(key->_M_dataplus)._M_p);
  bVar1 = cmCacheManager::CacheIterator::PropertyExists(&local_18,propertyName);
  if (bVar1) {
    pcVar2 = cmCacheManager::CacheIterator::GetProperty(&local_18,propertyName);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

const char* cmState::GetCacheEntryProperty(std::string const& key,
                                              std::string const& propertyName)
{
  cmCacheManager::CacheIterator it = this->CacheManager
             ->GetCacheIterator(key.c_str());
  if (!it.PropertyExists(propertyName))
    {
    return 0;
    }
  return it.GetProperty(propertyName);
}